

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

void __thiscall wasm::FunctionValidator::visitArrayCopy(FunctionValidator *this,ArrayCopy *curr)

{
  Type TVar1;
  bool bVar2;
  Type local_68;
  PackedType local_60;
  Type local_58;
  PackedType local_50;
  int local_4c;
  Type local_48;
  Type local_40;
  HeapType local_38;
  HeapType srcHeapType;
  HeapType destHeapType;
  
  ValidationInfo::shouldBeTrue<wasm::ArrayCopy*>
            (this->info,
             (bool)((byte)((((this->
                             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                             ).
                             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                             .
                             super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                            .currModule)->features).features >> 10) & 1),curr,
             "array.copy requires gc [--enable-gc]",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  ValidationInfo::shouldBeEqualOrFirstIsUnreachable<wasm::ArrayCopy*,wasm::Type>
            (this->info,(Type)(curr->srcIndex->type).id,(Type)0x2,curr,
             "array.copy src index must be an i32",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  ValidationInfo::shouldBeEqualOrFirstIsUnreachable<wasm::ArrayCopy*,wasm::Type>
            (this->info,(Type)(curr->destIndex->type).id,(Type)0x2,curr,
             "array.copy dest index must be an i32",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)69>).super_Expression.type.id != 1) {
    TVar1.id = (curr->srcRef->type).id;
    wasm::Type::Type(&local_48,(HeapType)0x6,Nullable);
    bVar2 = shouldBeSubType(this,TVar1,local_48,(Expression *)curr,
                            "array.copy source should be an array reference");
    if (bVar2) {
      TVar1.id = (curr->destRef->type).id;
      wasm::Type::Type(&local_40,(HeapType)0x6,Nullable);
      bVar2 = shouldBeSubType(this,TVar1,local_40,(Expression *)curr,
                              "array.copy destination should be an array reference");
      if (bVar2) {
        local_38 = wasm::Type::getHeapType(&curr->srcRef->type);
        srcHeapType = wasm::Type::getHeapType(&curr->destRef->type);
        if (local_38.id != 0xb) {
          bVar2 = HeapType::isArray(&local_38);
          bVar2 = ValidationInfo::shouldBeTrue<wasm::ArrayCopy*>
                            (this->info,bVar2,curr,"array.copy source should be an array reference",
                             (this->
                             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                             ).
                             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                             .
                             super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                             .currFunction);
          if ((bVar2) && (srcHeapType.id != 0xb)) {
            bVar2 = HeapType::isArray(&srcHeapType);
            bVar2 = ValidationInfo::shouldBeTrue<wasm::ArrayCopy*>
                              (this->info,bVar2,curr,
                               "array.copy destination should be an array reference",
                               (this->
                               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                               ).
                               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                               .
                               super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                               .currFunction);
            if (bVar2) {
              HeapType::getArray((HeapType *)&local_68);
              HeapType::getArray((HeapType *)&local_58);
              shouldBeSubType(this,local_68,local_58,(Expression *)curr,
                              "array.copy must have the proper types");
              ValidationInfo::shouldBeEqual<wasm::ArrayCopy*,wasm::Field::PackedType>
                        (this->info,local_60,local_50,curr,"array.copy types must match",
                         (this->
                         super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                         ).
                         super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                         .
                         super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                         .currFunction);
              ValidationInfo::shouldBeTrue<wasm::ArrayCopy*>
                        (this->info,local_4c != 0,curr,"array.copy destination must be mutable",
                         (this->
                         super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                         ).
                         super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                         .
                         super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                         .currFunction);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitArrayCopy(ArrayCopy* curr) {
  shouldBeTrue(getModule()->features.hasGC(),
               curr,
               "array.copy requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable(curr->srcIndex->type,
                                    Type(Type::i32),
                                    curr,
                                    "array.copy src index must be an i32");
  shouldBeEqualOrFirstIsUnreachable(curr->destIndex->type,
                                    Type(Type::i32),
                                    curr,
                                    "array.copy dest index must be an i32");
  if (curr->type == Type::unreachable) {
    return;
  }
  if (!shouldBeSubType(curr->srcRef->type,
                       Type(HeapType::array, Nullable),
                       curr,
                       "array.copy source should be an array reference")) {
    return;
  }
  if (!shouldBeSubType(curr->destRef->type,
                       Type(HeapType::array, Nullable),
                       curr,
                       "array.copy destination should be an array reference")) {
    return;
  }
  auto srcHeapType = curr->srcRef->type.getHeapType();
  auto destHeapType = curr->destRef->type.getHeapType();
  if (srcHeapType == HeapType::none ||
      !shouldBeTrue(srcHeapType.isArray(),
                    curr,
                    "array.copy source should be an array reference")) {
    return;
  }
  if (destHeapType == HeapType::none ||
      !shouldBeTrue(destHeapType.isArray(),
                    curr,
                    "array.copy destination should be an array reference")) {
    return;
  }
  const auto& srcElement = srcHeapType.getArray().element;
  const auto& destElement = destHeapType.getArray().element;
  shouldBeSubType(srcElement.type,
                  destElement.type,
                  curr,
                  "array.copy must have the proper types");
  shouldBeEqual(srcElement.packedType,
                destElement.packedType,
                curr,
                "array.copy types must match");
  shouldBeTrue(
    destElement.mutable_, curr, "array.copy destination must be mutable");
}